

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

int VP8LBitWriterClone(VP8LBitWriter *src,VP8LBitWriter *dst)

{
  int iVar1;
  size_t extra_size;
  
  extra_size = (long)src->cur_ - (long)src->buf_;
  iVar1 = VP8LBitWriterResize(dst,extra_size);
  if (iVar1 != 0) {
    memcpy(dst->buf_,src->buf_,extra_size);
    dst->bits_ = src->bits_;
    dst->used_ = src->used_;
    dst->error_ = src->error_;
    dst->cur_ = dst->buf_ + extra_size;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int VP8LBitWriterClone(const VP8LBitWriter* const src,
                       VP8LBitWriter* const dst) {
  const size_t current_size = src->cur_ - src->buf_;
  assert(src->cur_ >= src->buf_ && src->cur_ <= src->end_);
  if (!VP8LBitWriterResize(dst, current_size)) return 0;
  memcpy(dst->buf_, src->buf_, current_size);
  dst->bits_ = src->bits_;
  dst->used_ = src->used_;
  dst->error_ = src->error_;
  dst->cur_ = dst->buf_ + current_size;
  return 1;
}